

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_add_header(nng_http *conn,char *key,char *val)

{
  nng_err nVar1;
  char *val_local;
  char *key_local;
  nng_http *conn_local;
  
  nVar1 = nni_http_add_header(conn,key,val);
  return nVar1;
}

Assistant:

nng_err
nng_http_add_header(nng_http *conn, const char *key, const char *val)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_add_header(conn, key, val));
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(key);
	NNI_ARG_UNUSED(val);
	return (NNG_ENOTSUP);
#endif
}